

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O1

ImPlotTick * __thiscall ImPlotTickCollection::Append(ImPlotTickCollection *this,ImPlotTick *tick)

{
  uint uVar1;
  float *pfVar2;
  int iVar3;
  ImPlotTick *pIVar4;
  double dVar5;
  undefined8 uVar6;
  ImPlotTick *__dest;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  
  if (tick->ShowLabel == true) {
    fVar9 = (tick->LabelSize).x;
    this->TotalWidth = this->TotalWidth + fVar9;
    fVar10 = (tick->LabelSize).y;
    this->TotalHeight = this->TotalHeight + fVar10;
    if (fVar9 <= this->MaxWidth) {
      fVar9 = this->MaxWidth;
    }
    this->MaxWidth = fVar9;
    if (fVar10 <= this->MaxHeight) {
      fVar10 = this->MaxHeight;
    }
    this->MaxHeight = fVar10;
  }
  iVar8 = (this->Ticks).Size;
  iVar3 = (this->Ticks).Capacity;
  if (iVar8 == iVar3) {
    iVar8 = iVar8 + 1;
    if (iVar3 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar3 / 2 + iVar3;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar3 < iVar8) {
      __dest = (ImPlotTick *)ImGui::MemAlloc((long)iVar8 << 5);
      pIVar4 = (this->Ticks).Data;
      if (pIVar4 != (ImPlotTick *)0x0) {
        memcpy(__dest,pIVar4,(long)(this->Ticks).Size << 5);
        ImGui::MemFree((this->Ticks).Data);
      }
      (this->Ticks).Data = __dest;
      (this->Ticks).Capacity = iVar8;
    }
  }
  pIVar4 = (this->Ticks).Data;
  iVar8 = (this->Ticks).Size;
  dVar5 = tick->PlotPos;
  fVar9 = tick->PixelPos;
  fVar10 = (tick->LabelSize).x;
  uVar6 = *(undefined8 *)&tick->Major;
  pfVar2 = &pIVar4[iVar8].LabelSize.y;
  *(undefined8 *)pfVar2 = *(undefined8 *)&(tick->LabelSize).y;
  *(undefined8 *)(pfVar2 + 2) = uVar6;
  pIVar4 = pIVar4 + iVar8;
  pIVar4->PlotPos = dVar5;
  pIVar4->PixelPos = fVar9;
  (pIVar4->LabelSize).x = fVar10;
  iVar8 = (this->Ticks).Size;
  uVar1 = iVar8 + 1;
  (this->Ticks).Size = uVar1;
  this->Size = this->Size + 1;
  if (-1 < iVar8) {
    return (this->Ticks).Data + ((ulong)uVar1 - 1);
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x695,"T &ImVector<ImPlotTick>::back() [T = ImPlotTick]");
}

Assistant:

const ImPlotTick& Append(const ImPlotTick& tick) {
        if (tick.ShowLabel) {
            TotalWidth    += tick.ShowLabel ? tick.LabelSize.x : 0;
            TotalHeight   += tick.ShowLabel ? tick.LabelSize.y : 0;
            MaxWidth      =  tick.LabelSize.x > MaxWidth  ? tick.LabelSize.x : MaxWidth;
            MaxHeight     =  tick.LabelSize.y > MaxHeight ? tick.LabelSize.y : MaxHeight;
        }
        Ticks.push_back(tick);
        Size++;
        return Ticks.back();
    }